

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void wiener_filter_stripe
               (RestorationUnitInfo *rui,int stripe_width,int stripe_height,int procunit_width,
               uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int32_t *tmpbuf,int bit_depth
               ,aom_internal_error_info *error_info)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  uint8_t *dst_p;
  uint8_t *src_p;
  int w;
  int j;
  WienerConvolveParams conv_params;
  uint local_5c;
  int local_40;
  WienerConvolveParams local_3c;
  int local_34;
  long local_30;
  uint local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_3c = get_conv_params_wiener(8);
  for (local_40 = 0; local_40 < local_1c; local_40 = local_24 + local_40) {
    if ((int)local_24 < (int)((local_1c - local_40) + 0xfU & 0xfffffff0)) {
      local_5c = local_24;
    }
    else {
      local_5c = (local_1c - local_40) + 0xfU & 0xfffffff0;
    }
    (*av1_wiener_convolve_add_src)
              ((uint8_t *)(local_30 + local_40),(long)local_34,
               (uint8_t *)(in_stack_00000008 + local_40),(long)in_stack_00000010,
               (int16_t *)(local_18 + 0x20),0x10,(int16_t *)(local_18 + 0x10),0x10,local_5c,local_20
               ,&local_3c);
  }
  return;
}

Assistant:

static void wiener_filter_stripe(const RestorationUnitInfo *rui,
                                 int stripe_width, int stripe_height,
                                 int procunit_width, const uint8_t *src,
                                 int src_stride, uint8_t *dst, int dst_stride,
                                 int32_t *tmpbuf, int bit_depth,
                                 struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)bit_depth;
  (void)error_info;
  assert(bit_depth == 8);
  const WienerConvolveParams conv_params = get_conv_params_wiener(8);

  for (int j = 0; j < stripe_width; j += procunit_width) {
    int w = AOMMIN(procunit_width, (stripe_width - j + 15) & ~15);
    const uint8_t *src_p = src + j;
    uint8_t *dst_p = dst + j;
    av1_wiener_convolve_add_src(
        src_p, src_stride, dst_p, dst_stride, rui->wiener_info.hfilter, 16,
        rui->wiener_info.vfilter, 16, w, stripe_height, &conv_params);
  }
}